

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

string * __thiscall
HighsIis::iisBoundStatusToString_abi_cxx11_(HighsIis *this,HighsInt bound_status)

{
  int in_EDX;
  string *in_RDI;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  if (in_EDX == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Dropped",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_EDX == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"   Null",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"   Free",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"  Lower",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_EDX == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"  Upper",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (in_EDX == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"  Boxed",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"*****",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  return in_RDI;
}

Assistant:

std::string HighsIis::iisBoundStatusToString(HighsInt bound_status) const {
  if (bound_status == kIisBoundStatusDropped) return "Dropped";
  if (bound_status == kIisBoundStatusNull) return "   Null";
  if (bound_status == kIisBoundStatusFree) return "   Free";
  if (bound_status == kIisBoundStatusLower) return "  Lower";
  if (bound_status == kIisBoundStatusUpper) return "  Upper";
  if (bound_status == kIisBoundStatusBoxed) return "  Boxed";
  return "*****";
}